

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O3

void __thiscall
slang::driver::SourceLoader::addSearchExtension(SourceLoader *this,string_view extension)

{
  flat_hash_set<std::string_view> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  byte bVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  value_type_pointer pbVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  int iVar37;
  uint uVar38;
  uint64_t hash;
  char *key;
  ulong uVar39;
  size_t len;
  ulong uVar40;
  long lVar41;
  size_type __rlen;
  undefined1 auVar42 [16];
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  byte bVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  byte bVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  byte bVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  byte bVar58;
  size_t pos;
  value_type *elements;
  locator res;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  group_type_pointer local_78;
  value_type_pointer local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  key = extension._M_str;
  len = extension._M_len;
  arrays_ = &this->uniqueExtensions;
  local_a0._M_len = len;
  local_a0._M_str = key;
  hash = detail::hashing::hash(key,len);
  uVar40 = hash >> ((byte)(this->uniqueExtensions).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_size_index & 0x3f);
  local_78 = (this->uniqueExtensions).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_;
  lVar41 = (hash & 0xff) * 4;
  uVar43 = (&UNK_0092f4ac)[lVar41];
  uVar44 = (&UNK_0092f4ad)[lVar41];
  uVar45 = (&UNK_0092f4ae)[lVar41];
  bVar46 = (&UNK_0092f4af)[lVar41];
  local_70 = (this->uniqueExtensions).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.elements_;
  local_80 = (ulong)((uint)hash & 7);
  local_90 = (this->uniqueExtensions).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_size_mask;
  uVar39 = 0;
  uVar47 = uVar43;
  uVar48 = uVar44;
  uVar49 = uVar45;
  bVar50 = bVar46;
  uVar51 = uVar43;
  uVar52 = uVar44;
  uVar53 = uVar45;
  bVar54 = bVar46;
  uVar55 = uVar43;
  uVar56 = uVar44;
  uVar57 = uVar45;
  bVar58 = bVar46;
  local_88 = uVar40;
  do {
    pbVar20 = local_70;
    pgVar2 = local_78 + uVar40;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar3 = pgVar2->m[0xf].n;
    auVar42[0] = -(local_58 == uVar43);
    auVar42[1] = -(uStack_57 == uVar44);
    auVar42[2] = -(uStack_56 == uVar45);
    auVar42[3] = -(bStack_55 == bVar46);
    auVar42[4] = -(uStack_54 == uVar47);
    auVar42[5] = -(uStack_53 == uVar48);
    auVar42[6] = -(uStack_52 == uVar49);
    auVar42[7] = -(bStack_51 == bVar50);
    auVar42[8] = -(uStack_50 == uVar51);
    auVar42[9] = -(uStack_4f == uVar52);
    auVar42[10] = -(uStack_4e == uVar53);
    auVar42[0xb] = -(bStack_4d == bVar54);
    auVar42[0xc] = -(uStack_4c == uVar55);
    auVar42[0xd] = -(uStack_4b == uVar56);
    auVar42[0xe] = -(uStack_4a == uVar57);
    auVar42[0xf] = -(bVar3 == bVar58);
    bStack_49 = bVar3;
    uVar21 = uVar43;
    uVar22 = uVar44;
    uVar23 = uVar45;
    bVar24 = bVar46;
    uVar25 = uVar47;
    uVar26 = uVar48;
    uVar27 = uVar49;
    bVar28 = bVar50;
    uVar29 = uVar51;
    uVar30 = uVar52;
    uVar31 = uVar53;
    bVar32 = bVar54;
    uVar33 = uVar55;
    uVar34 = uVar56;
    uVar35 = uVar57;
    bVar36 = bVar58;
    uVar4 = local_68;
    uVar5 = uStack_67;
    uVar6 = uStack_66;
    bVar7 = bStack_65;
    uVar8 = uStack_64;
    uVar9 = uStack_63;
    uVar10 = uStack_62;
    bVar11 = bStack_61;
    uVar12 = uStack_60;
    uVar13 = uStack_5f;
    uVar14 = uStack_5e;
    bVar15 = bStack_5d;
    uVar16 = uStack_5c;
    uVar17 = uStack_5b;
    uVar18 = uStack_5a;
    bVar19 = bStack_59;
    for (uVar38 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe); bStack_59 = bVar36,
        uStack_5a = uVar35, uStack_5b = uVar34, uStack_5c = uVar33, bStack_5d = bVar32,
        uStack_5e = uVar31, uStack_5f = uVar30, uStack_60 = uVar29, bStack_61 = bVar28,
        uStack_62 = uVar27, uStack_63 = uVar26, uStack_64 = uVar25, bStack_65 = bVar24,
        uStack_66 = uVar23, uStack_67 = uVar22, local_68 = uVar21, uVar38 != 0;
        uVar38 = uVar38 - 1 & uVar38) {
      iVar37 = 0;
      if (uVar38 != 0) {
        for (; (uVar38 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
        }
      }
      if (*(size_t *)((long)&pbVar20[uVar40 * 0xf]._M_len + (ulong)(uint)(iVar37 << 4)) == len) {
        if (len == 0) {
          return;
        }
        iVar37 = bcmp(key,*(void **)((long)&pbVar20[uVar40 * 0xf]._M_str +
                                    (ulong)(uint)(iVar37 << 4)),len);
        uVar43 = local_68;
        uVar44 = uStack_67;
        uVar45 = uStack_66;
        bVar46 = bStack_65;
        uVar47 = uStack_64;
        uVar48 = uStack_63;
        uVar49 = uStack_62;
        bVar50 = bStack_61;
        uVar51 = uStack_60;
        uVar52 = uStack_5f;
        uVar53 = uStack_5e;
        bVar54 = bStack_5d;
        uVar55 = uStack_5c;
        uVar56 = uStack_5b;
        uVar57 = uStack_5a;
        bVar58 = bStack_59;
        if (iVar37 == 0) {
          return;
        }
      }
      uVar21 = local_68;
      uVar22 = uStack_67;
      uVar23 = uStack_66;
      bVar24 = bStack_65;
      uVar25 = uStack_64;
      uVar26 = uStack_63;
      uVar27 = uStack_62;
      bVar28 = bStack_61;
      uVar29 = uStack_60;
      uVar30 = uStack_5f;
      uVar31 = uStack_5e;
      bVar32 = bStack_5d;
      uVar33 = uStack_5c;
      uVar34 = uStack_5b;
      uVar35 = uStack_5a;
      bVar36 = bStack_59;
      uVar4 = local_68;
      uVar5 = uStack_67;
      uVar6 = uStack_66;
      bVar7 = bStack_65;
      uVar8 = uStack_64;
      uVar9 = uStack_63;
      uVar10 = uStack_62;
      bVar11 = bStack_61;
      uVar12 = uStack_60;
      uVar13 = uStack_5f;
      uVar14 = uStack_5e;
      bVar15 = bStack_5d;
      uVar16 = uStack_5c;
      uVar17 = uStack_5b;
      uVar18 = uStack_5a;
      bVar19 = bStack_59;
    }
    local_68 = uVar4;
    uStack_67 = uVar5;
    uStack_66 = uVar6;
    bStack_65 = bVar7;
    uStack_64 = uVar8;
    uStack_63 = uVar9;
    uStack_62 = uVar10;
    bStack_61 = bVar11;
    uStack_60 = uVar12;
    uStack_5f = uVar13;
    uStack_5e = uVar14;
    bStack_5d = bVar15;
    uStack_5c = uVar16;
    uStack_5b = uVar17;
    uStack_5a = uVar18;
    bStack_59 = bVar19;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_80] & bVar3) == 0) break;
    lVar41 = uVar40 + uVar39;
    uVar39 = uVar39 + 1;
    uVar40 = lVar41 + 1U & local_90;
  } while (uVar39 <= local_90);
  if ((this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.size <
      (this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)arrays_,(arrays_type *)arrays_,local_88,hash,&local_a0);
    psVar1 = &(this->uniqueExtensions).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)arrays_,hash,&local_a0);
  }
  std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)&this->searchExtensions,&local_a0);
  return;
}

Assistant:

void SourceLoader::addSearchExtension(std::string_view extension) {
    if (uniqueExtensions.emplace(extension).second)
        searchExtensions.emplace_back(extension);
}